

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

void __thiscall i2p::sam::Session::CreateIfNotCreatedAlready(Session *this)

{
  CService *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar *puVar2;
  long lVar3;
  Sock *pSVar4;
  pointer puVar5;
  pointer puVar6;
  string str;
  undefined1 auVar7 [8];
  bool bVar8;
  int iVar9;
  Logger *pLVar10;
  char *args;
  long lVar11;
  undefined8 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  string_view source_file;
  string_view source_file_00;
  Span<unsigned_char> bytes;
  string_view logging_function;
  string_view logging_function_00;
  pointer in_stack_fffffffffffffe08;
  pointer in_stack_fffffffffffffe10;
  pointer in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined1 local_1d8 [8];
  char *session_type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_1b8;
  Reply local_1a8;
  string local_130;
  direct_or_indirect local_110;
  size_type local_100 [2];
  long local_f8;
  uint16_t local_f0;
  undefined6 uStack_ee;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d0;
  uint256 hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> session_id;
  string errmsg;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  pSVar4 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  errmsg._M_dataplus._M_p = (pointer)paVar1;
  if ((pSVar4 != (Sock *)0x0) &&
     (iVar9 = (*pSVar4->_vptr_Sock[0x13])(pSVar4,&errmsg), (char)iVar9 != '\0')) goto LAB_0087829f;
  session_type = "persistent";
  if (this->m_transient != false) {
    session_type = "transient";
  }
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  bytes.m_size = 0x20;
  bytes.m_data = (uchar *)&hash;
  GetRandBytes(bytes);
  base_blob<256u>::GetHex_abi_cxx11_((string *)&local_110.indirect_contents,&hash);
  args = (char *)0xa;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&session_id,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_110.indirect_contents,0,10);
  if ((size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]) != local_100) {
    operator_delete((size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]),
                    CONCAT44(local_100[1],local_100[0]) + 1);
  }
  pLVar10 = LogInstance();
  bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar10,I2P,Debug);
  if (bVar8) {
    Proxy::ToString_abi_cxx11_((string *)&local_110.indirect_contents,&this->m_control_host);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a1;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp";
    source_file._M_len = 0x57;
    args = "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
    ;
    logging_function._M_str = "CreateIfNotCreatedAlready";
    logging_function._M_len = 0x19;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x1a1,I2P,Debug,(ConstevalFormatString<3U>)0xf6fd7d,
               &session_type,&session_id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_110.indirect_contents);
    if ((size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]) != local_100) {
      operator_delete((size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]),
                      CONCAT44(local_100[1],local_100[0]) + 1);
    }
  }
  Hello((Session *)local_1d8);
  auVar7 = local_1d8;
  if (this->m_transient == true) {
    tinyformat::format<std::__cxx11::string>
              ((string *)&hash,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1"
               ,(char *)&session_id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    SendRequestAndGetReply
              ((Reply *)&local_110.indirect_contents,this,(Sock *)auVar7,(string *)&hash,true);
    puVar2 = hash.super_base_blob<256U>.m_data._M_elems + 0x10;
    if ((uchar *)hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar2) {
      operator_delete((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                      hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"DESTINATION","");
    Reply::Get((string *)&hash,(Reply *)&local_110.indirect_contents,&local_130);
    DecodeI2PBase64((Binary *)&stack0xfffffffffffffe08,(string *)&hash);
    puVar5 = (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffe08;
    (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_fffffffffffffe10;
    (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe18;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5,(long)puVar6 - (long)puVar5);
    }
    if ((uchar *)hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar2) {
      operator_delete((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                      hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(uStack_ee,local_f0) != &local_e0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT62(uStack_ee,local_f0),local_e0._M_allocated_capacity + 1);
    }
    if ((size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]) != local_100) {
      lVar11 = CONCAT44(local_100[1],local_100[0]);
      uVar12 = (size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]);
LAB_0087805b:
      operator_delete((void *)uVar12,lVar11 + 1);
    }
  }
  else {
    ReadBinaryFile_abi_cxx11_
              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_110.indirect_contents,&this->m_private_key_file,0xffffffffffffffff);
    if (local_110.direct[0] == '\x01') {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_private_key,
                 local_110._8_8_,CONCAT44(local_100[1],local_100[0]) + local_110._8_8_);
    }
    else {
      GenerateAndSavePrivateKey(this,(Sock *)local_1d8);
    }
    puVar5 = (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    input.m_size = (long)(this->m_private_key).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar5;
    input.m_data = puVar5;
    EncodeBase64_abi_cxx11_(&local_130,input);
    SwapBase64((string *)&hash,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
    auVar7 = local_1d8;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_130,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3"
               ,(char *)&session_id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hash,in_R8);
    SendRequestAndGetReply(&local_1a8,this,(Sock *)auVar7,&local_130,true);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1a8.keys._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.request._M_dataplus._M_p != &local_1a8.request.field_2) {
      operator_delete(local_1a8.request._M_dataplus._M_p,
                      local_1a8.request.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.full._M_dataplus._M_p != &local_1a8.full.field_2) {
      operator_delete(local_1a8.full._M_dataplus._M_p,
                      local_1a8.full.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
    if ((uchar *)hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
        hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
      operator_delete((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                      hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    lVar11 = local_f8;
    uVar12 = local_110._8_8_;
    if ((size_type *)local_110._8_8_ != local_100 + 2) goto LAB_0087805b;
  }
  MyDestination((Binary *)&local_130,this);
  DestBinToAddr((CNetAddr *)&hash,(Binary *)&local_130);
  CService::CService((CService *)&local_110.indirect_contents,(CNetAddr *)&hash,0);
  this_00 = &this->m_my_addr;
  if (0x10 < (this->m_my_addr).super_CNetAddr.m_addr._size) {
    free((this_00->super_CNetAddr).m_addr._union.indirect_contents.indirect);
  }
  (this_00->super_CNetAddr).m_addr._union.indirect_contents.indirect =
       (char *)CONCAT71(local_110._1_7_,local_110.direct[0]);
  *(undefined8 *)((long)&(this->m_my_addr).super_CNetAddr.m_addr._union + 8) = local_110._8_8_;
  (this->m_my_addr).super_CNetAddr.m_addr._size = local_100[0];
  local_100[0] = 0;
  (this->m_my_addr).super_CNetAddr.m_net = (undefined4)local_f8;
  (this->m_my_addr).super_CNetAddr.m_scope_id = local_f8._4_4_;
  (this->m_my_addr).port = local_f0;
  if (0x10 < (uint)hash.super_base_blob<256U>.m_data._M_elems._16_4_) {
    free((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_);
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_130._M_dataplus._M_p,
                    local_130.field_2._M_allocated_capacity - (long)local_130._M_dataplus._M_p);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->m_session_id,&session_id);
  auVar7 = local_1d8;
  local_1d8 = (undefined1  [8])0x0;
  pSVar4 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)auVar7;
  if (pSVar4 != (Sock *)0x0) {
    (*pSVar4->_vptr_Sock[1])();
  }
  pLVar10 = LogInstance();
  bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar10,I2P,Info);
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,session_type,(allocator<char> *)&local_130);
    str._M_string_length = (size_type)in_stack_fffffffffffffe10;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe08;
    str.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe18;
    str.field_2._8_8_ = in_stack_fffffffffffffe20;
    Capitalize((string *)&local_110.indirect_contents,str);
    CService::ToStringAddrPort_abi_cxx11_((string *)&hash,this_00);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "CreateIfNotCreatedAlready";
    logging_function_00._M_len = 0x19;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (logging_function_00,source_file_00,0x1c9,I2P,Info,(ConstevalFormatString<3U>)0xf6fea7
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_110.indirect_contents,&this->m_session_id,(string *)&hash);
    if ((uchar *)hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
        hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
      operator_delete((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                      hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    if ((size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]) != local_100) {
      operator_delete((size_type *)CONCAT71(local_110._1_7_,local_110.direct[0]),
                      CONCAT44(local_100[1],local_100[0]) + 1);
    }
    if ((_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> *)
        local_1c8._M_allocated_capacity != &local_1b8) {
      operator_delete((void *)local_1c8._M_allocated_capacity,(ulong)(local_1b8._M_head_impl + 1));
    }
  }
  if (local_1d8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_1d8 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)session_id._M_dataplus._M_p != &session_id.field_2) {
    operator_delete(session_id._M_dataplus._M_p,session_id.field_2._M_allocated_capacity + 1);
  }
LAB_0087829f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errmsg._M_dataplus._M_p != paVar1) {
    operator_delete(errmsg._M_dataplus._M_p,
                    CONCAT71(errmsg.field_2._M_allocated_capacity._1_7_,
                             errmsg.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Session::CreateIfNotCreatedAlready()
{
    std::string errmsg;
    if (m_control_sock && m_control_sock->IsConnected(errmsg)) {
        return;
    }

    const auto session_type = m_transient ? "transient" : "persistent";
    const auto session_id = GetRandHash().GetHex().substr(0, 10); // full is overkill, too verbose in the logs

    LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Creating %s SAM session %s with %s\n", session_type, session_id, m_control_host.ToString());

    auto sock = Hello();

    if (m_transient) {
        // The destination (private key) is generated upon session creation and returned
        // in the reply in DESTINATION=.
        const Reply& reply = SendRequestAndGetReply(
            *sock,
            strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 "
                      "i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1",
                      session_id));

        m_private_key = DecodeI2PBase64(reply.Get("DESTINATION"));
    } else {
        // Read our persistent destination (private key) from disk or generate
        // one and save it to disk. Then use it when creating the session.
        const auto& [read_ok, data] = ReadBinaryFile(m_private_key_file);
        if (read_ok) {
            m_private_key.assign(data.begin(), data.end());
        } else {
            GenerateAndSavePrivateKey(*sock);
        }

        const std::string& private_key_b64 = SwapBase64(EncodeBase64(m_private_key));

        SendRequestAndGetReply(*sock,
                               strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s "
                                         "i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3",
                                         session_id,
                                         private_key_b64));
    }

    m_my_addr = CService(DestBinToAddr(MyDestination()), I2P_SAM31_PORT);
    m_session_id = session_id;
    m_control_sock = std::move(sock);

    LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "%s SAM session %s created, my address=%s\n",
        Capitalize(session_type),
        m_session_id,
        m_my_addr.ToStringAddrPort());
}